

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsDefineProperty(JsValueRef object,JsPropertyIdRef propertyId,JsValueRef propertyDescriptor,
                bool *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  BOOL BVar2;
  JsErrorCode JVar3;
  JsrtContext *pJVar4;
  RecyclableObject *pRVar5;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  pJVar4 = JsrtContext::GetCurrent();
  if (pJVar4 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTDefineProperty
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,object,
               (PropertyRecord *)propertyId,propertyDescriptor);
  }
  if (object != (JsValueRef)0x0) {
    BVar2 = Js::JavascriptOperators::IsObject(object);
    JVar3 = JsErrorArgumentNotObject;
    if (BVar2 == 0) goto LAB_00374df1;
    pRVar5 = Js::VarTo<Js::RecyclableObject>(object);
    pSVar1 = (((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 != scriptContext) {
      JVar3 = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00374df1;
      object = Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
    }
    if ((propertyId != (JsPropertyIdRef)0x0) && (propertyDescriptor != (JsValueRef)0x0)) {
      JVar3 = JsErrorInvalidArgument;
      if (0xf < *(uint *)((long)propertyId + 8)) {
        BVar2 = Js::JavascriptOperators::IsObject(propertyDescriptor);
        JVar3 = JsErrorArgumentNotObject;
        if (BVar2 != 0) {
          pRVar5 = Js::VarTo<Js::RecyclableObject>(propertyDescriptor);
          pSVar1 = (((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            JVar3 = JsErrorWrongRuntime;
            if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00374df1;
            propertyDescriptor = Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
          }
          if (result == (bool *)0x0) {
            JVar3 = JsErrorNullArgument;
          }
          else {
            *result = false;
            JVar3 = JsDefinePropertyCommon
                              (scriptContext,object,(PropertyRecord *)propertyId,propertyDescriptor,
                               result);
          }
        }
      }
      goto LAB_00374df1;
    }
  }
  JVar3 = JsErrorInvalidArgument;
LAB_00374df1:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
    if (*(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)
     ((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar3;
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsDefineProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId,
    _In_ JsValueRef propertyDescriptor, _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTDefineProperty, object, (const Js::PropertyRecord *)propertyId, propertyDescriptor);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        VALIDATE_INCOMING_OBJECT(propertyDescriptor, scriptContext);
        PARAM_NOT_NULL(result);
        *result = false;

        return JsDefinePropertyCommon(scriptContext, object, (const Js::PropertyRecord *)propertyId,
            propertyDescriptor, result);
    });
}